

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetMetaDataOperatorData::LoadRowGroupMetadata
          (ParquetMetaDataOperatorData *this,ClientContext *context,
          vector<duckdb::LogicalType,_true> *return_types,OpenFileInfo *file)

{
  vector<duckdb_parquet::SchemaElement,_true> *this_00;
  pointer pcVar1;
  duckdb *pdVar2;
  pointer pKVar3;
  ColumnDataScanState *pCVar4;
  undefined8 uVar5;
  pointer pVVar6;
  const_reference schema;
  const_reference pvVar7;
  const_reference pvVar8;
  reference schema_ele;
  InternalException *this_01;
  long lVar9;
  type *extraout_RDX;
  type *extraout_RDX_00;
  type *extraout_RDX_01;
  type *entry_00;
  type *entry_01;
  type *extraout_RDX_02;
  type *extraout_RDX_03;
  type *extraout_RDX_04;
  type *entry_02;
  KeyValue *entry;
  duckdb *this_02;
  pointer pKVar10;
  size_type __n;
  _Hash_node_base *__n_00;
  ulong uVar11;
  size_type __n_01;
  LogicalType *type;
  pointer pMVar12;
  vector<duckdb::Value,_true> map_keys;
  DataChunk current_chunk;
  vector<duckdb::Value,_true> map_values;
  vector<duckdb::ParquetColumnSchema,_true> column_schemas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  encoding_string;
  ParquetOptions parquet_options;
  ParquetReader reader;
  undefined1 local_558 [16];
  pointer pVStack_548;
  FileMetaData *local_530;
  DataChunk local_528 [24];
  pointer local_510;
  const_reference local_4e8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_4d8;
  ColumnDataScanState *local_4c0;
  __node_base local_4b8;
  size_type local_4b0;
  undefined1 local_4a8 [56];
  pointer pVStack_470;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> local_430;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> local_418;
  pointer local_3f8;
  idx_t local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [32];
  ParquetMetaDataOperatorData *local_3b8;
  vector<duckdb_parquet::RowGroup,_true> *local_3b0;
  OpenFileInfo *local_3a8;
  vector<duckdb_parquet::ColumnChunk,_true> *local_3a0;
  undefined1 *local_398 [2];
  undefined1 local_388 [16];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_378;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_358;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> local_338;
  undefined1 local_328 [32];
  element_type *local_308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_300;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f8 [3];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  string local_2c0;
  string local_2a0;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  ParquetOptions local_260;
  ParquetOptions local_220;
  LogicalType local_1e0 [24];
  ParquetReader local_1c8;
  
  local_4c0 = (ColumnDataScanState *)&this->collection;
  duckdb::ColumnDataCollection::Reset();
  ParquetOptions::ParquetOptions(&local_260,context);
  pcVar1 = (file->path)._M_dataplus._M_p;
  local_3f8 = (pointer)local_3e8;
  local_3a8 = file;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,pcVar1,pcVar1 + (file->path)._M_string_length);
  if (local_3f8 == (pointer)local_3e8) {
    local_328._24_8_ = local_3e8._8_8_;
    local_328._0_8_ = (pointer)(local_328 + 0x10);
  }
  else {
    local_328._0_8_ = local_3f8;
  }
  local_328._8_8_ = local_3f0;
  local_3f0 = 0;
  local_3e8[0] = 0;
  local_308 = (element_type *)0x0;
  _Stack_300._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_220.binary_as_string = local_260.binary_as_string;
  local_220.file_row_number = local_260.file_row_number;
  local_220.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_260.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_220.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_260.encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
  if (local_260.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_260.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_260.encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_260.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_260.encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_220.debug_use_openssl = local_260.debug_use_openssl;
  local_3f8 = (pointer)local_3e8;
  local_3b8 = this;
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  vector(&local_220.schema.
          super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         ,&local_260.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
        );
  local_220.explicit_cardinality = local_260.explicit_cardinality;
  local_338.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_338.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ParquetReader::ParquetReader(&local_1c8,context,(OpenFileInfo *)local_328,&local_220,&local_338);
  if (local_338.internal.
      super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.internal.
               super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&local_220.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  if (local_220.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_220.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_300._M_pi);
  }
  if ((pointer)local_328._0_8_ != (pointer)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_);
  }
  if (local_3f8 != (pointer)local_3e8) {
    operator_delete(local_3f8);
  }
  duckdb::DataChunk::DataChunk(local_528);
  duckdb::DataChunk::Initialize((ClientContext *)local_528,(vector *)context,(ulong)return_types);
  local_530 = ParquetReader::GetFileMetadata(&local_1c8);
  local_418.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((local_530->schema).
      super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
      super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_530->schema).
      super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
      super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &local_530->schema;
    __n_01 = 0;
    do {
      schema = vector<duckdb_parquet::SchemaElement,_true>::operator[](this_00,__n_01);
      if (schema->num_children < 1) {
        ParquetColumnSchema::ParquetColumnSchema((ParquetColumnSchema *)local_4a8);
        ParquetReader::DeriveLogicalType
                  ((ParquetReader *)local_558,(SchemaElement *)&local_1c8,
                   (ParquetColumnSchema *)schema);
        pVVar6 = pVStack_470;
        uVar5 = local_4a8._48_8_;
        pVStack_470 = pVStack_548;
        local_4a8._48_8_ = local_558._8_8_;
        local_4a8._40_2_ = local_558._0_2_;
        pVStack_548 = pVVar6;
        local_558._8_8_ = uVar5;
        duckdb::LogicalType::~LogicalType((LogicalType *)local_558);
        std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        emplace_back<duckdb::ParquetColumnSchema>(&local_418,(ParquetColumnSchema *)local_4a8);
        std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector(&local_430);
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_4a8 + 0x28));
        if ((undefined1 *)local_4a8._8_8_ != local_4a8 + 0x18) {
          operator_delete((void *)local_4a8._8_8_);
        }
      }
      __n_01 = __n_01 + 1;
    } while (__n_01 < (ulong)(((long)(local_530->schema).
                                     super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     .
                                     super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->schema).
                                     super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     .
                                     super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7063e7063e7063e7));
  }
  if ((local_530->row_groups).
      super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (local_530->row_groups).
      super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pMVar12 = (pointer)0x0;
  }
  else {
    local_3b0 = &local_530->row_groups;
    pMVar12 = (pointer)0x0;
    __n_00 = (_Hash_node_base *)0x0;
    do {
      local_4b8._M_nxt = __n_00;
      pvVar7 = vector<duckdb_parquet::RowGroup,_true>::operator[](local_3b0,(size_type)__n_00);
      uVar11 = ((long)(pvVar7->columns).
                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                      .
                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar7->columns).
                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                      .
                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x3333333333333333;
      lVar9 = (long)local_418.
                    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_418.
                    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      if ((ulong)(lVar9 * -0x71c71c71c71c71c7) <= uVar11 && uVar11 + lVar9 * 0x71c71c71c71c71c7 != 0
         ) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_4a8._0_8_ = local_4a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4a8,"Too many column in row group: corrupt file?","");
        duckdb::InternalException::InternalException(this_01,(string *)local_4a8);
        __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((pvVar7->columns).
          super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
          super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pvVar7->columns).
          super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
          super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_3a0 = &pvVar7->columns;
        __n = 0;
        local_4e8 = pvVar7;
        do {
          pvVar8 = vector<duckdb_parquet::ColumnChunk,_true>::operator[](local_3a0,__n);
          local_4b0 = __n;
          schema_ele = vector<duckdb::ParquetColumnSchema,_true>::operator[]
                                 ((vector<duckdb::ParquetColumnSchema,_true> *)&local_418,__n);
          pcVar1 = (local_3a8->path)._M_dataplus._M_p;
          local_398[0] = local_388;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_398,pcVar1,pcVar1 + (local_3a8->path)._M_string_length);
          duckdb::Value::Value((Value *)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,0,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          if (local_398[0] != local_388) {
            operator_delete(local_398[0]);
          }
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,1,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,2,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,3,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,4,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,5,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ParquetElementBigint<long_const&>
                    ((duckdb *)local_4a8,&pvVar8->file_offset,
                     (bool)(((byte)local_4e8->__isset & 2) >> 1));
          duckdb::DataChunk::SetValue((ulong)local_528,6,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,7,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          local_558._0_8_ = &pVStack_548;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_558,", ","");
          duckdb::StringUtil::Join
                    ((vector *)local_280,(string *)&(pvVar8->meta_data).path_in_schema);
          duckdb::Value::Value((Value *)local_4a8,(vector *)local_280);
          duckdb::DataChunk::SetValue((ulong)local_528,8,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          entry_00 = extraout_RDX;
          if (local_280[0] != local_270) {
            operator_delete(local_280[0]);
            entry_00 = extraout_RDX_00;
          }
          if ((pointer)local_558._0_8_ != (pointer)&pVStack_548) {
            operator_delete((void *)local_558._0_8_);
            entry_00 = extraout_RDX_01;
          }
          ConvertParquetElementToString<duckdb_parquet::Type::type_const&>
                    (&local_2a0,(duckdb *)&(pvVar8->meta_data).type,entry_00);
          duckdb::Value::Value((Value *)local_4a8,&local_2a0);
          duckdb::DataChunk::SetValue((ulong)local_528,9,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          type = &schema_ele->type;
          ConvertParquetStats((duckdb *)local_4a8,type,schema_ele,
                              (bool)(((byte)(pvVar8->meta_data).statistics.__isset & 2) >> 1),
                              &(pvVar8->meta_data).statistics.min);
          duckdb::DataChunk::SetValue((ulong)local_528,10,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ConvertParquetStats((duckdb *)local_4a8,type,schema_ele,
                              (bool)((byte)(pvVar8->meta_data).statistics.__isset & 1),
                              &(pvVar8->meta_data).statistics.max);
          duckdb::DataChunk::SetValue((ulong)local_528,0xb,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ParquetElementBigint<long_const&>
                    ((duckdb *)local_4a8,&(pvVar8->meta_data).statistics.null_count,
                     (bool)(((byte)(pvVar8->meta_data).statistics.__isset & 4) >> 2));
          duckdb::DataChunk::SetValue((ulong)local_528,0xc,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ParquetElementBigint<long_const&>
                    ((duckdb *)local_4a8,&(pvVar8->meta_data).statistics.distinct_count,
                     (bool)(((byte)(pvVar8->meta_data).statistics.__isset & 8) >> 3));
          duckdb::DataChunk::SetValue((ulong)local_528,0xd,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ConvertParquetStats((duckdb *)local_4a8,type,schema_ele,
                              (bool)(((byte)(pvVar8->meta_data).statistics.__isset & 0x20) >> 5),
                              &(pvVar8->meta_data).statistics.min_value);
          duckdb::DataChunk::SetValue((ulong)local_528,0xe,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ConvertParquetStats((duckdb *)local_4a8,type,schema_ele,
                              (bool)(((byte)(pvVar8->meta_data).statistics.__isset & 0x10) >> 4),
                              &(pvVar8->meta_data).statistics.max_value);
          duckdb::DataChunk::SetValue((ulong)local_528,0xf,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ConvertParquetElementToString<duckdb_parquet::CompressionCodec::type_const&>
                    (&local_2c0,(duckdb *)&(pvVar8->meta_data).codec,entry_01);
          duckdb::Value::Value((Value *)local_4a8,&local_2c0);
          duckdb::DataChunk::SetValue((ulong)local_528,0x10,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p);
          }
          local_3d8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3d8._8_8_ = 0;
          local_3d8._16_8_ =
               (tuple<duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>)
               0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3d8,
                    (long)(pvVar8->meta_data).encodings.
                          super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          .
                          super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar8->meta_data).encodings.
                          super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          .
                          super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2);
          pdVar2 = (duckdb *)
                   (pvVar8->meta_data).encodings.
                   super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                   .
                   super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          entry_02 = extraout_RDX_02;
          for (this_02 = (duckdb *)
                         (pvVar8->meta_data).encodings.
                         super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                         .
                         super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                         ._M_impl.super__Vector_impl_data._M_start; this_02 != pdVar2;
              this_02 = this_02 + 4) {
            ConvertParquetElementToString<duckdb_parquet::Encoding::type_const&>
                      ((string *)local_4a8,this_02,entry_02);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_3d8,(string *)local_4a8);
            entry_02 = extraout_RDX_03;
            if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
              operator_delete((void *)local_4a8._0_8_);
              entry_02 = extraout_RDX_04;
            }
          }
          local_558._0_8_ = &pVStack_548;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_558,", ","");
          duckdb::StringUtil::Join((vector *)local_2e0,(string *)local_3d8);
          duckdb::Value::Value((Value *)local_4a8,(vector *)local_2e0);
          duckdb::DataChunk::SetValue((ulong)local_528,0x11,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          if (local_2e0[0] != local_2d0) {
            operator_delete(local_2e0[0]);
          }
          if ((pointer)local_558._0_8_ != (pointer)&pVStack_548) {
            operator_delete((void *)local_558._0_8_);
          }
          ParquetElementBigint<long_const&>
                    ((duckdb *)local_4a8,&(pvVar8->meta_data).index_page_offset,
                     (bool)(((byte)(pvVar8->meta_data).__isset & 2) >> 1));
          duckdb::DataChunk::SetValue((ulong)local_528,0x12,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ParquetElementBigint<long_const&>
                    ((duckdb *)local_4a8,&(pvVar8->meta_data).dictionary_page_offset,
                     (bool)(((byte)(pvVar8->meta_data).__isset & 4) >> 2));
          duckdb::DataChunk::SetValue((ulong)local_528,0x13,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,0x14,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,0x15,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          duckdb::Value::BIGINT((long)local_4a8);
          duckdb::DataChunk::SetValue((ulong)local_528,0x16,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          pVStack_548 = (pointer)0x0;
          local_558._0_8_ = (pointer)0x0;
          local_558._8_8_ = (pointer)0x0;
          local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pKVar3 = (pvVar8->meta_data).key_value_metadata.
                   super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   .
                   super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pKVar10 = (pvVar8->meta_data).key_value_metadata.
                         super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                         .
                         super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                         ._M_impl.super__Vector_impl_data._M_start; pKVar10 != pKVar3;
              pKVar10 = pKVar10 + 1) {
            duckdb::Value::BLOB((uchar *)local_4a8,(ulong)(pKVar10->key)._M_dataplus._M_p);
            std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_558,
                       (Value *)local_4a8);
            duckdb::Value::~Value((Value *)local_4a8);
            duckdb::Value::BLOB((uchar *)local_4a8,(ulong)(pKVar10->value)._M_dataplus._M_p);
            std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                      (&local_4d8,(Value *)local_4a8);
            duckdb::Value::~Value((Value *)local_4a8);
          }
          duckdb::LogicalType::LogicalType((LogicalType *)local_2f8,BLOB);
          duckdb::LogicalType::LogicalType(local_1e0,BLOB);
          local_358.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_558._0_8_;
          local_358.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_558._8_8_;
          local_358.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pVStack_548;
          local_558._0_8_ = (pointer)0x0;
          local_558._8_8_ = (pointer)0x0;
          pVStack_548 = (pointer)0x0;
          local_378.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start._0_4_;
          local_378.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
          local_378.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_;
          local_378.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_;
          local_378.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_4d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          duckdb::Value::MAP((string *)local_4a8,local_2f8,local_1e0,&local_358,&local_378);
          duckdb::DataChunk::SetValue((ulong)local_528,0x17,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_378);
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_358);
          duckdb::LogicalType::~LogicalType(local_1e0);
          duckdb::LogicalType::~LogicalType((LogicalType *)local_2f8);
          ParquetElementBigint<long_const&>
                    ((duckdb *)local_4a8,&(pvVar8->meta_data).bloom_filter_offset,
                     (bool)(((byte)(pvVar8->meta_data).__isset & 0x20) >> 5));
          duckdb::DataChunk::SetValue((ulong)local_528,0x18,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ParquetElementBigint<int_const&>
                    ((duckdb *)local_4a8,&(pvVar8->meta_data).bloom_filter_length,
                     (bool)(((byte)(pvVar8->meta_data).__isset & 0x40) >> 6));
          duckdb::DataChunk::SetValue((ulong)local_528,0x19,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ParquetElementBoolean
                    ((duckdb *)local_4a8,(pvVar8->meta_data).statistics.is_min_value_exact,
                     (bool)((byte)(pvVar8->meta_data).statistics.__isset >> 7));
          duckdb::DataChunk::SetValue((ulong)local_528,0x1a,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          ParquetElementBoolean
                    ((duckdb *)local_4a8,(pvVar8->meta_data).statistics.is_max_value_exact,
                     (bool)(((byte)(pvVar8->meta_data).statistics.__isset & 0x40) >> 6));
          duckdb::DataChunk::SetValue((ulong)local_528,0x1b,(Value *)pMVar12);
          duckdb::Value::~Value((Value *)local_4a8);
          pMVar12 = (pointer)((long)&(pMVar12->name)._M_dataplus._M_p + 1);
          if ((pointer)0x7ff < pMVar12) {
            local_510 = pMVar12;
            duckdb::ColumnDataCollection::Append((DataChunk *)local_4c0);
            duckdb::DataChunk::Reset();
            pMVar12 = (pointer)0x0;
          }
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_4d8);
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_558);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3d8);
          __n = local_4b0 + 1;
        } while (__n < (ulong)(((long)(local_4e8->columns).
                                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      .
                                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_4e8->columns).
                                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      .
                                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 7) *
                              -0x3333333333333333));
      }
      __n_00 = (_Hash_node_base *)((long)&(local_4b8._M_nxt)->_M_nxt + 1);
    } while (__n_00 < (_Hash_node_base *)
                      (((long)(local_530->row_groups).
                              super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                              .
                              super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_530->row_groups).
                              super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                              .
                              super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)
            );
  }
  pCVar4 = local_4c0;
  local_510 = pMVar12;
  duckdb::ColumnDataCollection::Append((DataChunk *)local_4c0);
  duckdb::ColumnDataCollection::InitializeScan(pCVar4,(char)local_3b8 + 0x78);
  std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&local_418);
  duckdb::DataChunk::~DataChunk(local_528);
  ParquetReader::~ParquetReader(&local_1c8);
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&local_260.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  if (local_260.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ParquetMetaDataOperatorData::LoadRowGroupMetadata(ClientContext &context, const vector<LogicalType> &return_types,
                                                       const OpenFileInfo &file) {
	collection.Reset();
	ParquetOptions parquet_options(context);
	ParquetReader reader(context, file.path, parquet_options);
	idx_t count = 0;
	DataChunk current_chunk;
	current_chunk.Initialize(context, return_types);
	auto meta_data = reader.GetFileMetadata();
	vector<ParquetColumnSchema> column_schemas;
	for (idx_t schema_idx = 0; schema_idx < meta_data->schema.size(); schema_idx++) {
		auto &schema_element = meta_data->schema[schema_idx];
		if (schema_element.num_children > 0) {
			continue;
		}
		ParquetColumnSchema column_schema;
		column_schema.type = reader.DeriveLogicalType(schema_element, column_schema);
		column_schemas.push_back(std::move(column_schema));
	}

	for (idx_t row_group_idx = 0; row_group_idx < meta_data->row_groups.size(); row_group_idx++) {
		auto &row_group = meta_data->row_groups[row_group_idx];

		if (row_group.columns.size() > column_schemas.size()) {
			throw InternalException("Too many column in row group: corrupt file?");
		}
		for (idx_t col_idx = 0; col_idx < row_group.columns.size(); col_idx++) {
			auto &column = row_group.columns[col_idx];
			auto &column_schema = column_schemas[col_idx];
			auto &col_meta = column.meta_data;
			auto &stats = col_meta.statistics;
			auto &column_type = column_schema.type;

			// file_name, LogicalType::VARCHAR
			current_chunk.SetValue(0, count, file.path);

			// row_group_id, LogicalType::BIGINT
			current_chunk.SetValue(1, count, Value::BIGINT(UnsafeNumericCast<int64_t>(row_group_idx)));

			// row_group_num_rows, LogicalType::BIGINT
			current_chunk.SetValue(2, count, Value::BIGINT(row_group.num_rows));

			// row_group_num_columns, LogicalType::BIGINT
			current_chunk.SetValue(3, count, Value::BIGINT(UnsafeNumericCast<int64_t>(row_group.columns.size())));

			// row_group_bytes, LogicalType::BIGINT
			current_chunk.SetValue(4, count, Value::BIGINT(row_group.total_byte_size));

			// column_id, LogicalType::BIGINT
			current_chunk.SetValue(5, count, Value::BIGINT(UnsafeNumericCast<int64_t>(col_idx)));

			// file_offset, LogicalType::BIGINT
			current_chunk.SetValue(6, count, ParquetElementBigint(column.file_offset, row_group.__isset.file_offset));

			// num_values, LogicalType::BIGINT
			current_chunk.SetValue(7, count, Value::BIGINT(col_meta.num_values));

			// path_in_schema, LogicalType::VARCHAR
			current_chunk.SetValue(8, count, StringUtil::Join(col_meta.path_in_schema, ", "));

			// type, LogicalType::VARCHAR
			current_chunk.SetValue(9, count, ConvertParquetElementToString(col_meta.type));

			// stats_min, LogicalType::VARCHAR
			current_chunk.SetValue(10, count,
			                       ConvertParquetStats(column_type, column_schema, stats.__isset.min, stats.min));

			// stats_max, LogicalType::VARCHAR
			current_chunk.SetValue(11, count,
			                       ConvertParquetStats(column_type, column_schema, stats.__isset.max, stats.max));

			// stats_null_count, LogicalType::BIGINT
			current_chunk.SetValue(12, count, ParquetElementBigint(stats.null_count, stats.__isset.null_count));

			// stats_distinct_count, LogicalType::BIGINT
			current_chunk.SetValue(13, count, ParquetElementBigint(stats.distinct_count, stats.__isset.distinct_count));

			// stats_min_value, LogicalType::VARCHAR
			current_chunk.SetValue(
			    14, count, ConvertParquetStats(column_type, column_schema, stats.__isset.min_value, stats.min_value));

			// stats_max_value, LogicalType::VARCHAR
			current_chunk.SetValue(
			    15, count, ConvertParquetStats(column_type, column_schema, stats.__isset.max_value, stats.max_value));

			// compression, LogicalType::VARCHAR
			current_chunk.SetValue(16, count, ConvertParquetElementToString(col_meta.codec));

			// encodings, LogicalType::VARCHAR
			vector<string> encoding_string;
			encoding_string.reserve(col_meta.encodings.size());
			for (auto &encoding : col_meta.encodings) {
				encoding_string.push_back(ConvertParquetElementToString(encoding));
			}
			current_chunk.SetValue(17, count, Value(StringUtil::Join(encoding_string, ", ")));

			// index_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    18, count, ParquetElementBigint(col_meta.index_page_offset, col_meta.__isset.index_page_offset));

			// dictionary_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    19, count,
			    ParquetElementBigint(col_meta.dictionary_page_offset, col_meta.__isset.dictionary_page_offset));

			// data_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(20, count, Value::BIGINT(col_meta.data_page_offset));

			// total_compressed_size, LogicalType::BIGINT
			current_chunk.SetValue(21, count, Value::BIGINT(col_meta.total_compressed_size));

			// total_uncompressed_size, LogicalType::BIGINT
			current_chunk.SetValue(22, count, Value::BIGINT(col_meta.total_uncompressed_size));

			// key_value_metadata, LogicalType::MAP(LogicalType::BLOB, LogicalType::BLOB)
			vector<Value> map_keys, map_values;
			for (auto &entry : col_meta.key_value_metadata) {
				map_keys.push_back(Value::BLOB_RAW(entry.key));
				map_values.push_back(Value::BLOB_RAW(entry.value));
			}
			current_chunk.SetValue(
			    23, count,
			    Value::MAP(LogicalType::BLOB, LogicalType::BLOB, std::move(map_keys), std::move(map_values)));

			// bloom_filter_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    24, count, ParquetElementBigint(col_meta.bloom_filter_offset, col_meta.__isset.bloom_filter_offset));

			// bloom_filter_length, LogicalType::BIGINT
			current_chunk.SetValue(
			    25, count, ParquetElementBigint(col_meta.bloom_filter_length, col_meta.__isset.bloom_filter_length));

			// min_is_exact, LogicalType::BOOLEAN
			current_chunk.SetValue(26, count,
			                       ParquetElementBoolean(stats.is_min_value_exact, stats.__isset.is_min_value_exact));

			// max_is_exact, LogicalType::BOOLEAN
			current_chunk.SetValue(27, count,
			                       ParquetElementBoolean(stats.is_max_value_exact, stats.__isset.is_max_value_exact));

			count++;
			if (count >= STANDARD_VECTOR_SIZE) {
				current_chunk.SetCardinality(count);
				collection.Append(current_chunk);

				count = 0;
				current_chunk.Reset();
			}
		}
	}
	current_chunk.SetCardinality(count);
	collection.Append(current_chunk);

	collection.InitializeScan(scan_state);
}